

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::ClassNamePrefix<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,string *classname,EnumDescriptor *desc)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  FileOptions *this;
  string *__lhs;
  allocator local_46;
  allocator local_45 [20];
  allocator local_31;
  int local_30;
  byte local_29;
  int i;
  bool is_reserved;
  string *prefix;
  EnumDescriptor *desc_local;
  string *classname_local;
  
  prefix = (string *)desc;
  desc_local = (EnumDescriptor *)classname;
  classname_local = __return_storage_ptr__;
  pFVar2 = EnumDescriptor::file(desc);
  this = FileDescriptor::options(pFVar2);
  _i = FileOptions::php_class_prefix_abi_cxx11_(this);
  bVar1 = std::operator!=(_i,"");
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)_i);
  }
  else {
    local_29 = 0;
    for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              desc_local,kReservedNames[local_30]);
      if (bVar1) {
        local_29 = 1;
        break;
      }
    }
    if ((local_29 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_46);
      std::allocator<char>::~allocator((allocator<char> *)&local_46);
    }
    else {
      pFVar2 = EnumDescriptor::file((EnumDescriptor *)prefix);
      __lhs = FileDescriptor::package_abi_cxx11_(pFVar2);
      bVar1 = std::operator==(__lhs,"google.protobuf");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"GPB",&local_31);
        std::allocator<char>::~allocator((allocator<char> *)&local_31);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"PB",local_45);
        std::allocator<char>::~allocator((allocator<char> *)local_45);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNamePrefix(const string& classname,
                            const DescriptorType* desc) {
  const string& prefix = (desc->file()->options()).php_class_prefix();
  if (prefix != "") {
    return prefix;
  }

  bool is_reserved = false;

  for (int i = 0; i < kReservedNamesSize; i++) {
    if (classname == kReservedNames[i]) {
      is_reserved = true;
      break;
    }
  }

  if (is_reserved) {
    if (desc->file()->package() == "google.protobuf") {
      return "GPB";
    } else {
      return "PB";
    }
  }

  return "";
}